

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
::
nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>&&,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::basic_string_view<char,_std::char_traits<char>_>_&&,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_&&>
          *args)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  group_type_pointer pgVar3;
  vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  *pvVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  char *pcVar8;
  pointer ppCVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pgVar3 = arrays_->groups_;
  lVar10 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar13[0] = -(pgVar1->m[0].n == '\0');
  auVar13[1] = -(pgVar1->m[1].n == '\0');
  auVar13[2] = -(pgVar1->m[2].n == '\0');
  auVar13[3] = -(pgVar1->m[3].n == '\0');
  auVar13[4] = -(pgVar1->m[4].n == '\0');
  auVar13[5] = -(pgVar1->m[5].n == '\0');
  auVar13[6] = -(pgVar1->m[6].n == '\0');
  auVar13[7] = -(pgVar1->m[7].n == '\0');
  auVar13[8] = -(pgVar1->m[8].n == '\0');
  auVar13[9] = -(pgVar1->m[9].n == '\0');
  auVar13[10] = -(pgVar1->m[10].n == '\0');
  auVar13[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar13[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar13[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar13[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar13[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar12 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
  if (uVar12 == 0) {
    uVar5 = arrays_->groups_size_mask;
    lVar11 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar11 & uVar5;
      lVar10 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar14[0] = -(pgVar1->m[0].n == '\0');
      auVar14[1] = -(pgVar1->m[1].n == '\0');
      auVar14[2] = -(pgVar1->m[2].n == '\0');
      auVar14[3] = -(pgVar1->m[3].n == '\0');
      auVar14[4] = -(pgVar1->m[4].n == '\0');
      auVar14[5] = -(pgVar1->m[5].n == '\0');
      auVar14[6] = -(pgVar1->m[6].n == '\0');
      auVar14[7] = -(pgVar1->m[7].n == '\0');
      auVar14[8] = -(pgVar1->m[8].n == '\0');
      auVar14[9] = -(pgVar1->m[9].n == '\0');
      auVar14[10] = -(pgVar1->m[10].n == '\0');
      auVar14[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar14[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar14[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar14[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar14[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar7 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
      uVar12 = (uint)uVar7;
      lVar11 = lVar11 + 1;
    } while (uVar7 == 0);
  }
  uVar6 = 0;
  if (uVar12 != 0) {
    for (; (uVar12 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar6;
  pcVar8 = args->first->_M_str;
  (ppVar2->first)._M_len = args->first->_M_len;
  (ppVar2->first)._M_str = pcVar8;
  pvVar4 = args->second;
  ppCVar9 = (pvVar4->
            super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (ppVar2->second).
  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pvVar4->
       super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (ppVar2->second).
  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppCVar9;
  (ppVar2->second).
  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pvVar4->
       super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar4->
  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar4->
  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar4->
  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pgVar3->m + lVar10)[uVar6].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar10);
  __return_storage_ptr__->n = uVar6;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }